

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.h
# Opt level: O0

int __thiscall
kj::File::clone(File *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  Own<const_kj::FsNode,_std::nullptr_t> local_28;
  __fn *local_18;
  File *this_local;
  
  local_18 = __fn;
  this_local = this;
  (**(code **)(*(long *)__fn + 0x28))();
  Own<kj::FsNode_const,decltype(nullptr)>::downcast<kj::File_const>
            ((Own<kj::FsNode_const,decltype(nullptr)> *)this);
  Own<const_kj::FsNode,_std::nullptr_t>::~Own(&local_28);
  return (int)this;
}

Assistant:

inline Own<const File> File::clone() const { return cloneFsNode().downcast<const File>(); }